

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::execute_silver_linings(string *mesh_in,string *geo_out)

{
  int iVar1;
  clock_t cVar2;
  ostream *poVar3;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  string local_c8;
  int local_a8;
  allocator<char> local_a1;
  int outcome;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  clock_t local_20;
  clock_t execution_time;
  string *geo_out_local;
  string *mesh_in_local;
  
  execution_time = (clock_t)geo_out;
  geo_out_local = mesh_in;
  local_20 = clock();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"See logfile.txt for conversion information",&local_41);
  print_ln(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "=================================== START ==================================",
             &local_79);
  print_ln(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outcome,
             "-------------------------------- CONVERTING... -----------------------------",
             &local_a1);
  print_ln((string *)&outcome);
  std::__cxx11::string::~string((string *)&outcome);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::string((string *)&local_c8,(string *)mesh_in);
  std::__cxx11::string::string((string *)&local_e8,(string *)geo_out);
  iVar1 = begin_processing(&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  local_a8 = iVar1;
  if (iVar1 == 0) {
    cVar2 = clock();
    local_20 = cVar2 - local_20;
    poVar3 = std::operator<<((ostream *)&std::cout,"Program execution took ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_20 / 1e+06);
    poVar3 = std::operator<<(poVar3," seconds");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "============================== CONVERSION END ==============================",
               &local_131);
    print_ln(&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Error: Conversion failed. See logfile.txt for why.",&local_109)
    ;
    print_ln(&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  return;
}

Assistant:

void UI::execute_silver_linings(std::string mesh_in, std::string geo_out)
{
    clock_t execution_time;
    execution_time = clock();
    print_ln("See logfile.txt for conversion information");
    print_ln("=================================== START ==================================");
    print_ln("-------------------------------- CONVERTING... -----------------------------");
    int outcome = begin_processing(mesh_in, geo_out);
    if (outcome!=0)
    {
        print_ln("Error: Conversion failed. See logfile.txt for why.");
    }
    else
    {
        execution_time = clock() - execution_time;
        std::cout << "Program execution took "
        << (float)execution_time / CLOCKS_PER_SEC
        << " seconds" << std::endl;
        print_ln("============================== CONVERSION END ==============================");
    }
}